

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O0

GPU_Renderer * GPU_GetRenderer(GPU_RendererID id)

{
  int local_14;
  int i;
  
  gpu_init_renderer_register();
  if ((GPU_RendererEnum)id.name != 0) {
    for (local_14 = 0; local_14 < 0x14; local_14 = local_14 + 1) {
      if ((_gpu_renderer_map[local_14] != (GPU_Renderer *)0x0) &&
         ((GPU_RendererEnum)id.name == (_gpu_renderer_map[local_14]->id).renderer)) {
        return _gpu_renderer_map[local_14];
      }
    }
  }
  return (GPU_Renderer *)0x0;
}

Assistant:

GPU_Renderer* GPU_GetRenderer(GPU_RendererID id)
{
	int i;
	gpu_init_renderer_register();
	
	// Invalid enum?
	if(id.renderer == GPU_RENDERER_UNKNOWN)
        return NULL;
	
	for(i = 0; i < GPU_MAX_ACTIVE_RENDERERS; i++)
	{
		if(_gpu_renderer_map[i] == NULL)
			continue;
		
		if(id.renderer == _gpu_renderer_map[i]->id.renderer)
			return _gpu_renderer_map[i];
	}
    
    return NULL;
}